

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-surface.c
# Opt level: O0

_Bool plutovg_surface_write_to_jpg_stream
                (plutovg_surface_t *surface,plutovg_write_func_t write_func,void *closure,
                int quality)

{
  int iVar1;
  int success;
  int quality_local;
  void *closure_local;
  plutovg_write_func_t write_func_local;
  plutovg_surface_t *surface_local;
  
  plutovg_surface_write_begin(surface);
  iVar1 = stbi_write_jpg_to_func
                    (write_func,closure,surface->width,surface->height,4,surface->data,quality);
  plutovg_surface_write_end(surface);
  return iVar1 != 0;
}

Assistant:

bool plutovg_surface_write_to_jpg_stream(const plutovg_surface_t* surface, plutovg_write_func_t write_func, void* closure, int quality)
{
    plutovg_surface_write_begin(surface);
    int success = stbi_write_jpg_to_func(write_func, closure, surface->width, surface->height, 4, surface->data, quality);
    plutovg_surface_write_end(surface);
    return success;
}